

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Session::~Session(Session *this)

{
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Session_002161a8;
  cleanUp();
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ConfigData::~ConfigData(&this->m_configData);
  clara::detail::Parser::~Parser(&this->m_cli);
  return;
}

Assistant:

Session::~Session() {
        Catch::cleanUp();
    }